

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set_heavy.cc
# Opt level: O2

MessageLite * __thiscall
google::protobuf::internal::ExtensionSet::GetMessage
          (ExtensionSet *this,int number,Descriptor *message_type,MessageFactory *factory)

{
  int iVar1;
  const_iterator cVar2;
  undefined4 extraout_var;
  LogMessage *pLVar3;
  _Base_ptr p_Var4;
  LogFinisher local_5d;
  int number_local;
  LogMessage local_58;
  
  number_local = number;
  cVar2 = std::
          _Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
          ::find((_Rb_tree<int,_std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>,_std::_Select1st<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>,_std::less<int>,_std::allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>_>
                  *)this,&number_local);
  if (((_Rb_tree_header *)cVar2._M_node == &(this->extensions_)._M_t._M_impl.super__Rb_tree_header)
     || (((ulong)cVar2._M_node[1]._M_left & 0x10000) != 0)) {
    iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
    p_Var4 = (_Base_ptr)CONCAT44(extraout_var,iVar1);
  }
  else {
    if (*(char *)((long)&cVar2._M_node[1]._M_left + 1) == '\x01') {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: ((iter->second).is_repeated ? FieldDescriptor::LABEL_REPEATED : FieldDescriptor::LABEL_OPTIONAL) == (FieldDescriptor::LABEL_OPTIONAL): "
                         );
      LogFinisher::operator=(&local_5d,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)*(byte *)&cVar2._M_node[1]._M_left * 4)
        != 10) {
      LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/deps/protobuf/src/google/protobuf/extension_set_heavy.cc"
                 ,0x99);
      pLVar3 = LogMessage::operator<<
                         (&local_58,
                          "CHECK failed: (cpp_type((iter->second).type)) == (FieldDescriptor::CPPTYPE_MESSAGE): "
                         );
      LogFinisher::operator=(&local_5d,pLVar3);
      LogMessage::~LogMessage(&local_58);
    }
    p_Var4 = cVar2._M_node[1]._M_parent;
    if (((ulong)cVar2._M_node[1]._M_left & 0x100000) != 0) {
      iVar1 = (*factory->_vptr_MessageFactory[2])(factory,message_type);
      p_Var4 = (_Base_ptr)(**(code **)(*(long *)p_Var4 + 0x18))(p_Var4,iVar1);
    }
  }
  return (MessageLite *)p_Var4;
}

Assistant:

const MessageLite& ExtensionSet::GetMessage(int number,
                                            const Descriptor* message_type,
                                            MessageFactory* factory) const {
  ExtensionMap::const_iterator iter = extensions_.find(number);
  if (iter == extensions_.end() || iter->second.is_cleared) {
    // Not present.  Return the default value.
    return *factory->GetPrototype(message_type);
  } else {
    GOOGLE_DCHECK_TYPE(iter->second, OPTIONAL, MESSAGE);
    if (iter->second.is_lazy) {
      return iter->second.lazymessage_value->GetMessage(
          *factory->GetPrototype(message_type));
    } else {
      return *iter->second.message_value;
    }
  }
}